

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O0

int __thiscall
OSSLEDDSA::sign(OSSLEDDSA *this,PrivateKey *privateKey,ByteString *dataToSign,ByteString *signature,
               Type mechanism,void *param_5,size_t param_6)

{
  uint uVar1;
  int iVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined4 extraout_var;
  undefined8 extraout_RAX_02;
  uchar *puVar3;
  EVP_MD_CTX *ctx_00;
  ulong uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  size_t sVar7;
  EVP_MD_CTX *ctx;
  size_t len;
  EVP_PKEY *pkey;
  OSSLEDPrivateKey *pk;
  ByteString *in_stack_ffffffffffffff88;
  OSSLEDPrivateKey *in_stack_ffffffffffffff90;
  EVP_MD_CTX *pEVar8;
  size_t local_50;
  EVP_PKEY *local_48;
  PrivateKey *local_40;
  void *local_38;
  Type local_2c;
  ByteString *local_28;
  ByteString *local_20;
  PrivateKey *local_18;
  OSSLEDDSA *local_10;
  undefined1 local_1;
  
  local_38 = param_5;
  local_2c = mechanism;
  local_28 = signature;
  local_20 = dataToSign;
  local_18 = privateKey;
  local_10 = this;
  if (mechanism == EDDSA) {
    uVar1 = (*(privateKey->super_Serialisable)._vptr_Serialisable[3])
                      (privateKey,OSSLEDPrivateKey::type);
    if ((uVar1 & 1) == 0) {
      softHSMLog(3,"sign",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                 ,0x3e,"Invalid key type supplied");
      local_1 = 0;
      uVar5 = extraout_RAX_00;
    }
    else {
      local_40 = local_18;
      local_48 = (EVP_PKEY *)OSSLEDPrivateKey::getOSSLKey(in_stack_ffffffffffffff90);
      if (local_48 == (EVP_PKEY *)0x0) {
        softHSMLog(3,"sign",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                   ,0x48,"Could not get the OpenSSL private key");
        local_1 = 0;
        uVar5 = extraout_RAX_01;
      }
      else {
        iVar2 = (*(local_40->super_Serialisable)._vptr_Serialisable[8])();
        local_50 = CONCAT44(extraout_var,iVar2);
        if (local_50 == 0) {
          softHSMLog(3,"sign",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                     ,0x51,"Could not get the order length");
          local_1 = 0;
          uVar5 = extraout_RAX_02;
        }
        else {
          local_50 = local_50 << 1;
          ByteString::resize((ByteString *)in_stack_ffffffffffffff90,
                             (size_t)in_stack_ffffffffffffff88);
          puVar3 = ByteString::operator[]
                             ((ByteString *)in_stack_ffffffffffffff90,
                              (size_t)in_stack_ffffffffffffff88);
          memset(puVar3,0,local_50);
          ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
          iVar2 = EVP_DigestSignInit(ctx_00,(EVP_PKEY_CTX **)0x0,(EVP_MD *)0x0,(ENGINE *)0x0,
                                     local_48);
          if (iVar2 == 0) {
            uVar4 = ERR_get_error();
            softHSMLog(3,"sign",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                       ,0x5a,"EDDSA sign init failed (0x%08X)",uVar4);
            uVar5 = EVP_MD_CTX_free(ctx_00);
            local_1 = 0;
          }
          else {
            pEVar8 = ctx_00;
            puVar3 = ByteString::operator[]((ByteString *)ctx_00,(size_t)in_stack_ffffffffffffff88);
            puVar6 = ByteString::const_byte_str(in_stack_ffffffffffffff88);
            sVar7 = ByteString::size((ByteString *)0x12db21);
            iVar2 = EVP_DigestSign(pEVar8,puVar3,&local_50,puVar6,sVar7);
            if (iVar2 == 0) {
              uVar4 = ERR_get_error();
              softHSMLog(3,"sign",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                         ,0x60,"EDDSA sign failed (0x%08X)",uVar4);
              uVar5 = EVP_MD_CTX_free(ctx_00);
              local_1 = 0;
            }
            else {
              uVar5 = EVP_MD_CTX_free(ctx_00);
              local_1 = 1;
            }
          }
        }
      }
    }
  }
  else {
    softHSMLog(3,"sign",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
               ,0x37,"Invalid mechanism supplied (%i)",(ulong)mechanism);
    local_1 = 0;
    uVar5 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)uVar5 >> 8),local_1);
}

Assistant:

bool OSSLEDDSA::sign(PrivateKey* privateKey, const ByteString& dataToSign,
		     ByteString& signature, const AsymMech::Type mechanism,
		     const void* /* param = NULL */, const size_t /* paramLen = 0 */)
{
	if (mechanism != AsymMech::EDDSA)
	{
		ERROR_MSG("Invalid mechanism supplied (%i)", mechanism);
		return false;
	}

	// Check if the private key is the right type
	if (!privateKey->isOfType(OSSLEDPrivateKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	OSSLEDPrivateKey* pk = (OSSLEDPrivateKey*) privateKey;
	EVP_PKEY* pkey = pk->getOSSLKey();

	if (pkey == NULL)
	{
		ERROR_MSG("Could not get the OpenSSL private key");

		return false;
	}

	// Perform the signature operation
	size_t len = pk->getOrderLength();
	if (len == 0)
	{
		ERROR_MSG("Could not get the order length");
		return false;
	}
	len *= 2;
	signature.resize(len);
	memset(&signature[0], 0, len);
	EVP_MD_CTX* ctx = EVP_MD_CTX_new();
	if (!EVP_DigestSignInit(ctx, NULL, NULL, NULL, pkey))
	{
		ERROR_MSG("EDDSA sign init failed (0x%08X)", ERR_get_error());
		EVP_MD_CTX_free(ctx);
		return false;
	}
	if (!EVP_DigestSign(ctx, &signature[0], &len, dataToSign.const_byte_str(), dataToSign.size()))
	{
		ERROR_MSG("EDDSA sign failed (0x%08X)", ERR_get_error());
		EVP_MD_CTX_free(ctx);
		return false;
	}
	EVP_MD_CTX_free(ctx);
	return true;
}